

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O0

void ft_outline_close(PVG_FT_Outline *ft)

{
  int local_18;
  int index;
  PVG_FT_Outline *ft_local;
  
  ft->contours_flag[ft->n_contours] = '\0';
  if (ft->n_contours == 0) {
    local_18 = 0;
  }
  else {
    local_18 = ft->contours[ft->n_contours + -1] + 1;
  }
  if (local_18 != ft->n_points) {
    ft->points[ft->n_points].x = ft->points[local_18].x;
    ft->points[ft->n_points].y = ft->points[local_18].y;
    ft->tags[ft->n_points] = '\x01';
    ft->n_points = ft->n_points + 1;
  }
  return;
}

Assistant:

static void ft_outline_close(PVG_FT_Outline* ft)
{
    ft->contours_flag[ft->n_contours] = 0;
    int index = ft->n_contours ? ft->contours[ft->n_contours - 1] + 1 : 0;
    if(index == ft->n_points)
        return;
    ft->points[ft->n_points].x = ft->points[index].x;
    ft->points[ft->n_points].y = ft->points[index].y;
    ft->tags[ft->n_points] = PVG_FT_CURVE_TAG_ON;
    ft->n_points++;
}